

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall
ADPlanner::PrintSearchPath(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,FILE *fOut)

{
  long lVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int costToGoal;
  int max_steps;
  int steps;
  int costFromStart;
  int PathCost;
  CMDPSTATE *nextstate;
  CMDPSTATE *state;
  ADState *searchstateinfo;
  int local_3c;
  int *local_30;
  int *local_28;
  long local_18;
  
  local_28 = *(int **)(in_RSI + 0x28);
  local_18 = in_RDX;
  if (in_RDX == 0) {
    local_18 = _stdout;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x90))(*(long **)(in_RDI + 8),*local_28,1,local_18);
  local_3c = 0;
  while( true ) {
    if ((*local_28 == **(int **)(in_RSI + 0x30) || 99999 < local_3c) ||
       (local_3c = local_3c + 1, *(long *)(local_28 + 0xe) == 0)) {
      return;
    }
    lVar1 = *(long *)(local_28 + 0xe);
    if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
      local_30 = *(int **)(lVar1 + 0x38);
    }
    else {
      local_30 = *(int **)(lVar1 + 0x30);
    }
    if (local_30 == (int *)0x0) break;
    if (*(int *)(lVar1 + 0x24) == 1000000000) {
      return;
    }
    local_28 = local_30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x90))(*(long **)(in_RDI + 8),*local_30,1,local_18);
  }
  return;
}

Assistant:

void ADPlanner::PrintSearchPath(ADSearchStateSpace_t* pSearchStateSpace, FILE* fOut)
{
    ADState* searchstateinfo;
    CMDPSTATE* state = pSearchStateSpace->searchgoalstate;
    CMDPSTATE* nextstate = NULL;

    if (fOut == NULL) fOut = stdout;

    int PathCost = ((ADState*)pSearchStateSpace->searchgoalstate->PlannerSpecificData)->g;

    SBPL_FPRINTF(fOut, "Printing a path from state %d to the search start state %d\n", state->StateID,
                 pSearchStateSpace->searchstartstate->StateID);
    SBPL_FPRINTF(fOut, "Path cost = %d:\n", PathCost);

    environment_->PrintState(state->StateID, true, fOut);

    int costFromStart = 0;
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != pSearchStateSpace->searchstartstate->StateID && steps < max_steps) {
        steps++;

        SBPL_FPRINTF(fOut, "state %d ", state->StateID);

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (bforwardsearch)
            nextstate = searchstateinfo->bestpredstate;
        else
            nextstate = searchstateinfo->bestnextstate;

        if (nextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since nextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since state->g == NULL\n");
            break;
        }

        int costToGoal = PathCost - costFromStart;
        if (!bforwardsearch) {
            //otherwise this cost is not even set
            costFromStart += searchstateinfo->costtobestnextstate;
        }

#if DEBUG
        if (searchstateinfo->g > searchstateinfo->v) {
            std::stringstream ss; ss << "ERROR: underconsistent state " << state->StateID << " is encountered";
            SBPL_FPRINTF(fOut, "%s\n", ss.str().c_str());
            throw SBPL_Exception(ss.str());
        }

        if (!bforwardsearch) { //otherwise this cost is not even set
            if(nextstate->PlannerSpecificData != NULL && searchstateinfo->g < searchstateinfo->costtobestnextstate + ((ADState*)(nextstate->PlannerSpecificData))->g)
            {
                const char* msg = "ERROR: g(source) < c(source,target) + g(target)";
                SBPL_FPRINTF(fOut, "%s\n", msg);
                throw SBPL_Exception(msg);
            }
        }
#endif

        //PrintSearchState(searchstateinfo, fOut);
        SBPL_FPRINTF(fOut, "-->state %d ctg = %d  ", nextstate->StateID, costToGoal);

        state = nextstate;

        environment_->PrintState(state->StateID, true, fOut);
    }

    if (state->StateID != pSearchStateSpace->searchstartstate->StateID) {
        SBPL_ERROR("ERROR: Failed to printsearchpath, max_steps reached\n");
        return;
    }
}